

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall Wasm::WasmBytecodeGenerator::EmitBrTable(WasmBytecodeGenerator *this)

{
  uint32 relativeDepth;
  uint uVar1;
  uint32 *puVar2;
  bool bVar3;
  WasmBinaryReader *pWVar4;
  EmitInfo EVar5;
  BlockInfo *this_00;
  BlockInfo *other;
  WasmCompilationException *this_01;
  ulong uVar6;
  ulong uVar7;
  PolymorphicEmitInfo polyExpr;
  PolymorphicEmitInfo polyExpr_00;
  PolymorphicEmitInfo expectedTypes;
  PolymorphicEmitInfo PVar8;
  PolymorphicEmitInfo local_78;
  EmitInfo local_68;
  EmitInfo scrutineeInfo;
  
  pWVar4 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar4 == (WasmBinaryReader *)0x0) {
    pWVar4 = (this->m_module->m_reader).ptr;
  }
  uVar6 = (ulong)(pWVar4->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  puVar2 = (pWVar4->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
  relativeDepth = (pWVar4->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget;
  local_78.count = 0;
  PolymorphicEmitInfo::Init(&local_78,(EmitInfo)0x1ffffffff);
  PVar8._4_4_ = 0;
  PVar8.count = local_78.count;
  PVar8.field_1.singleInfo = local_78.field_1.singleInfo;
  PVar8 = PopStackPolymorphic(this,PVar8,L"br_table expression must be of type i32");
  scrutineeInfo.super_EmitInfoBase.location = PVar8.count;
  EVar5 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&scrutineeInfo,0);
  local_68 = EVar5;
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])(this->m_writer,0x29,(ulong)EVar5 & 0xffffffff);
  scrutineeInfo.super_EmitInfoBase.location = 0;
  this_00 = GetBlockInfo(this,relativeDepth);
  uVar1 = (this_00->yieldInfo).count;
  expectedTypes._4_4_ = 0;
  expectedTypes.count = uVar1;
  if (uVar1 == 0) {
    PVar8 = (PolymorphicEmitInfo)ZEXT816(0);
  }
  else {
    expectedTypes.field_1.infos = (this_00->yieldInfo).field_1.infos;
    PVar8 = PopStackPolymorphic(this,expectedTypes,(char16 *)0x0);
    scrutineeInfo.super_EmitInfoBase.location = PVar8.count;
  }
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      other = GetBlockInfo(this,puVar2[uVar7]);
      bVar3 = BlockInfo::IsEquivalent(this_00,other);
      if (!bVar3) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"br_table target %u signature mismatch");
        __cxa_throw(this_01,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      polyExpr._0_8_ = PVar8._0_8_ & 0xffffffff;
      polyExpr.field_1.infos = PVar8.field_1.infos;
      YieldToBlock(this,other,polyExpr);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1b])
                (this->m_writer,0x2c,(ulong)(uint)other->label,EVar5,uVar7 & 0xffffffff);
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  polyExpr_00._0_8_ = PVar8._0_8_ & 0xffffffff;
  polyExpr_00.field_1.infos = PVar8.field_1.infos;
  YieldToBlock(this,this_00,polyExpr_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)this_00->label,0x2a);
  ReleaseLocation(this,&local_68);
  ReleaseLocation(this,(PolymorphicEmitInfo *)&scrutineeInfo);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitBrTable()
{
    const uint32 numTargets = GetReader()->m_currentNode.brTable.numTargets;
    const uint32* targetTable = GetReader()->m_currentNode.brTable.targetTable;
    const uint32 defaultEntry = GetReader()->m_currentNode.brTable.defaultTarget;

    // Compile scrutinee
    EmitInfo scrutineeInfo = PopStackPolymorphic(EmitInfo(WasmTypes::I32), _u("br_table expression must be of type i32")).GetInfo(0);

    m_writer->AsmReg2(Js::OpCodeAsmJs::BeginSwitch_Int, scrutineeInfo.location, scrutineeInfo.location);
    PolymorphicEmitInfo yieldValue;
    BlockInfo* defaultBlockInfo = GetBlockInfo(defaultEntry);
    if (defaultBlockInfo->HasYield())
    {
        yieldValue = PopStackPolymorphic(defaultBlockInfo);
    }

    // Compile cases
    for (uint32 i = 0; i < numTargets; i++)
    {
        uint32 target = targetTable[i];
        BlockInfo* blockInfo = GetBlockInfo(target);
        if (!defaultBlockInfo->IsEquivalent(blockInfo))
        {
            throw WasmCompilationException(_u("br_table target %u signature mismatch"));
        }
        YieldToBlock(blockInfo, yieldValue);
        m_writer->AsmBrReg1Const1(Js::OpCodeAsmJs::Case_IntConst, blockInfo->label, scrutineeInfo.location, i);
    }

    YieldToBlock(defaultBlockInfo, yieldValue);
    m_writer->AsmBr(defaultBlockInfo->label, Js::OpCodeAsmJs::EndSwitch_Int);
    ReleaseLocation(&scrutineeInfo);
    ReleaseLocation(&yieldValue);

    SetUnreachableState(true);
}